

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O3

void __thiscall
HawkTracer::parser::ProtocolReader::_read_event
          (ProtocolReader *this,bool *is_error,Event *event,Event *base_event)

{
  EventKlass *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer psVar1;
  bool bVar2;
  FieldTypeId FVar3;
  EventKlassField *pEVar4;
  FieldType value;
  FieldType local_58;
  bool *local_50;
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  local_48;
  
  this_00 = (event->_klass).
            super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (event->_klass).
            super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_50 = is_error;
  EventKlass::get_fields(&local_48,this_00);
  psVar1 = local_48.
           super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    psVar1 = local_48.
             super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  while( true ) {
    if (psVar1 == local_48.
                  super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
      ::~vector(&local_48);
      *local_50 = false;
      return;
    }
    local_58.f_UINT64 = 0;
    pEVar4 = (psVar1->
             super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    FVar3 = pEVar4->_type_id;
    if ((int)FVar3 < 9) {
      bVar2 = _read_numeric(this,&local_58,pEVar4);
      if (!bVar2) break;
      pEVar4 = (psVar1->
               super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      FVar3 = pEVar4->_type_id;
    }
    if (FVar3 == STRING) {
      bVar2 = _read_string(this,&local_58);
      if (!bVar2) break;
      pEVar4 = (psVar1->
               super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      FVar3 = pEVar4->_type_id;
    }
    if ((FVar3 == STRUCT) && (bVar2 = _read_struct(this,&local_58,pEVar4,event,base_event), !bVar2))
    break;
    pEVar4 = (psVar1->
             super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (this->_flat_events == true) {
      if (pEVar4->_type_id != STRUCT) {
        Event::set_value(event,pEVar4,local_58);
      }
    }
    else {
      Event::set_value(event,pEVar4,local_58);
    }
    psVar1 = psVar1 + 1;
  }
  *local_50 = true;
  std::
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void ProtocolReader::_read_event(bool& is_error, Event& event, Event* base_event)
{
    for (const auto& field : event.get_klass()->get_fields())
    {
        FieldType value{};
        if (((field->is_numeric() || field->get_type_id() == FieldTypeId::POINTER) && !_read_numeric(value, *field)) || // read numeric or pointer
                (field->get_type_id() == FieldTypeId::STRING && !_read_string(value)) || // read string
                (field->get_type_id() == FieldTypeId::STRUCT && !_read_struct(value, *field, &event, base_event))) // read struct
        {
            is_error = true;
            return;
        }

        if (_flat_events)
        {
            if (field->get_type_id() != FieldTypeId::STRUCT)
            {
                event.set_value(field.get(), value);
            }
        }
        else
        {
            event.set_value(field.get(), value);
        }
    }

    is_error = false;
}